

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          set<int,_std::less<int>,_std::allocator<int>_> *lhs,char *op,
          set<int,_std::less<int>,_std::allocator<int>_> *rhs)

{
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  String::String(&local_40,"{?}");
  String::String(&local_58,(char *)lhs);
  operator+(&local_28,&local_40,&local_58);
  String::String(&local_70,"{?}");
  operator+(__return_storage_ptr__,&local_28,&local_70);
  String::~String(&local_70);
  String::~String(&local_28);
  String::~String(&local_58);
  String::~String(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }